

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute.c
# Opt level: O3

Tree vmergetree(Tree t1,Tree t2)

{
  int iVar1;
  uint uVar2;
  Branch *pBVar3;
  Branch *pBVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  Branch *pBVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  Tree TVar19;
  
  pBVar4 = t2.branch;
  pBVar8 = t1.branch;
  iVar12 = t1.deg;
  iVar6 = t2.deg;
  iVar17 = (iVar12 + iVar6) * 2;
  pBVar3 = (Branch *)malloc((long)(iVar17 + -2) * 0xc - 0x18);
  iVar14 = (int)((long)iVar6 + -1);
  if (1 < iVar12) {
    lVar10 = 0;
    do {
      *(undefined8 *)((long)&pBVar3->x + lVar10) = *(undefined8 *)((long)&pBVar8->x + lVar10);
      *(int *)((long)&pBVar3->n + lVar10) = *(int *)((long)&pBVar8->n + lVar10) + iVar14;
      lVar10 = lVar10 + 0xc;
    } while ((ulong)(iVar12 - 1U) * 0xc != lVar10);
  }
  uVar2 = (iVar12 + iVar6) - 1;
  iVar1 = iVar12 * 2 + -3;
  lVar10 = (long)(int)(iVar12 - 1U);
  if (iVar12 < iVar12 + iVar6) {
    lVar11 = lVar10 * 0xc;
    uVar7 = t2._0_8_ & 0xffffffff;
    do {
      *(undefined8 *)((long)&pBVar3->x + lVar11) =
           *(undefined8 *)((long)&pBVar4[1 - (long)iVar12].x + lVar11);
      *(int *)((long)&pBVar3->n + lVar11) =
           *(int *)((long)&pBVar4[1 - (long)iVar12].n + lVar11) + iVar1;
      lVar11 = lVar11 + 0xc;
      uVar13 = (int)uVar7 - 1;
      uVar7 = (ulong)uVar13;
    } while (uVar13 != 0);
  }
  if ((int)uVar2 <= (int)(uVar2 + iVar12 + -3)) {
    lVar11 = (long)(int)uVar2 * 0xc + 8;
    iVar15 = iVar12 + -2;
    do {
      *(undefined8 *)((long)pBVar3 + lVar11 + -8) =
           *(undefined8 *)((long)pBVar8 + lVar11 + (long)iVar14 * -0xc + -8);
      *(int *)((long)&pBVar3->x + lVar11) =
           *(int *)((long)&pBVar8[-(long)iVar14].x + lVar11) + iVar14;
      lVar11 = lVar11 + 0xc;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
  }
  if ((int)(uVar2 + iVar12) <= iVar17 + -4) {
    lVar11 = (long)(int)(uVar2 + iVar12 + -2) * 0xc;
    iVar12 = iVar12 * 2 + -4;
    iVar14 = iVar6 + -2;
    do {
      *(undefined8 *)((long)&pBVar3->x + lVar11) =
           *(undefined8 *)((long)&pBVar4[-1 - (long)iVar12].x + lVar11);
      *(int *)((long)&pBVar3->n + lVar11) =
           *(int *)((long)pBVar4 + lVar11 + (long)iVar12 * -0xc + -4) + iVar1;
      lVar11 = lVar11 + 0xc;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
  }
  uVar13 = t2.length + t1.length;
  uVar7 = (ulong)uVar13;
  iVar17 = iVar17 + -5;
  iVar14 = pBVar8[lVar10].n;
  iVar12 = pBVar8[iVar14].x;
  iVar1 = pBVar4[pBVar4->n].x;
  iVar15 = pBVar4->x;
  iVar16 = iVar1;
  if (iVar1 < iVar12) {
    iVar16 = iVar12;
  }
  if (iVar16 < iVar15) {
    pBVar3[iVar17].x = iVar16;
    uVar7 = (ulong)((uVar13 - iVar15) + iVar16);
  }
  else {
    if (iVar12 < iVar1) {
      iVar1 = iVar12;
    }
    if (iVar15 < iVar1) {
      pBVar3[iVar17].x = iVar1;
      uVar7 = (ulong)((uVar13 - iVar1) + iVar15);
    }
    else {
      pBVar3[iVar17].x = iVar15;
    }
  }
  pBVar3[iVar17].y = pBVar4->y;
  pBVar3[iVar17].n = pBVar3[lVar10].n;
  pBVar3[lVar10].n = iVar17;
  uVar9 = (long)iVar14 + (long)iVar6 + -1;
  piVar5 = &pBVar3[uVar9].n;
  iVar14 = iVar17;
  uVar13 = pBVar3[uVar9].n;
  if ((uint)uVar9 != pBVar3[uVar9].n) {
    do {
      iVar17 = (int)uVar9;
      uVar9 = (ulong)uVar13;
      *piVar5 = iVar14;
      piVar5 = &pBVar3[(int)uVar13].n;
      bVar18 = uVar13 != pBVar3[(int)uVar13].n;
      iVar14 = iVar17;
      uVar13 = pBVar3[(int)uVar13].n;
    } while (bVar18);
  }
  *piVar5 = iVar17;
  TVar19._0_8_ = (ulong)uVar2 | uVar7 << 0x20;
  TVar19.branch = pBVar3;
  return TVar19;
}

Assistant:

Tree vmergetree(Tree t1, Tree t2)
{
    int i, prev, curr, next, extra, offset1, offset2;
    DTYPE coord1, coord2;
    Tree t;

    t.deg = t1.deg + t2.deg - 1;
    t.length = t1.length + t2.length;
    t.branch = (Branch *) malloc((2*t.deg-2)*sizeof(Branch));
    offset1 = t2.deg-1;
    offset2 = 2*t1.deg-3;

    for (i=0; i<=t1.deg-2; i++) {
        t.branch[i].x = t1.branch[i].x;
        t.branch[i].y = t1.branch[i].y;
        t.branch[i].n = t1.branch[i].n + offset1;
    }
    for (i=t1.deg-1; i<=t.deg-1; i++) {
        t.branch[i].x = t2.branch[i-t1.deg+1].x;
        t.branch[i].y = t2.branch[i-t1.deg+1].y;
        t.branch[i].n = t2.branch[i-t1.deg+1].n + offset2;
    }
    for (i=t.deg; i<=t.deg+t1.deg-3; i++) {
        t.branch[i].x = t1.branch[i-offset1].x;
        t.branch[i].y = t1.branch[i-offset1].y;
        t.branch[i].n = t1.branch[i-offset1].n + offset1;
    }
    for (i=t.deg+t1.deg-2; i<=2*t.deg-4; i++) {
        t.branch[i].x = t2.branch[i-offset2].x;
        t.branch[i].y = t2.branch[i-offset2].y;
        t.branch[i].n = t2.branch[i-offset2].n + offset2;
    }
    extra = 2*t.deg-3;
    coord1 = t1.branch[t1.branch[t1.deg-1].n].x;
    coord2 = t2.branch[t2.branch[0].n].x;
    if (t2.branch[0].x > max(coord1, coord2)) {
        t.branch[extra].x = max(coord1, coord2);
        t.length -= t2.branch[0].x - t.branch[extra].x;
    }        
    else if (t2.branch[0].x < min(coord1, coord2)) {
        t.branch[extra].x = min(coord1, coord2);
        t.length -= t.branch[extra].x - t2.branch[0].x;
    }
    else t.branch[extra].x = t2.branch[0].x;
    t.branch[extra].y = t2.branch[0].y;
    t.branch[extra].n = t.branch[t1.deg-1].n;
    t.branch[t1.deg-1].n = extra;

    prev = extra;
    curr = t1.branch[t1.deg-1].n + offset1;
    next = t.branch[curr].n;
    while (curr != next) {
        t.branch[curr].n = prev;
        prev = curr;
        curr = next;
        next = t.branch[curr].n;
    }
    t.branch[curr].n = prev;

    return t;
}